

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

int run_test(int inprocess)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 *extraout_RDX;
  int iVar2;
  uv_loop_t *puVar3;
  uv_thread_t tid;
  uv_process_t process;
  uv_buf_t uStack_a8;
  undefined1 auStack_98 [144];
  
  loop = (uv_loop_t *)auStack_98;
  puVar3 = (uv_loop_t *)auStack_98;
  if (inprocess == 0) {
    uStack_a8.len = 0x15f67c;
    spawn_helper(&ctx.channel,(uv_process_t *)(auStack_98 + 8),"ipc_send_recv_helper");
    uStack_a8.len = 0x15f68a;
    connect_cb(&ctx.connect_req,0);
LAB_0015f68a:
    uStack_a8.len = 0x15f68f;
    loop = uv_default_loop();
    iVar2 = 0;
    uStack_a8.len = 0x15f699;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) {
      uStack_a8.len = 0x15f6c4;
      run_test_cold_3();
LAB_0015f6c4:
      uStack_a8.len = 0x15f6c9;
      run_test_cold_4();
LAB_0015f6c9:
      uStack_a8.len = 0x15f6ce;
      run_test_cold_1();
      goto LAB_0015f6ce;
    }
    if (recv_cb_count != 2) goto LAB_0015f6c4;
    if (inprocess == 0) {
      return 0;
    }
    uStack_a8.len = 0x15f6b2;
    iVar1 = uv_thread_join((uv_thread_t *)auStack_98);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar2 = 0x15f5a9;
    uStack_a8.len = 0x15f60e;
    iVar1 = uv_thread_create((uv_thread_t *)auStack_98,ipc_send_recv_helper_threadproc,(void *)0x2a)
    ;
    if (iVar1 != 0) goto LAB_0015f6c9;
    uStack_a8.len = 0x15f620;
    uv_sleep(1000);
    uStack_a8.len = 0x15f625;
    loop = uv_default_loop();
    iVar2 = 0x2fef60;
    uStack_a8.len = 0x15f639;
    iVar1 = uv_pipe_init(loop,&ctx.channel,1);
    if (iVar1 == 0) {
      uStack_a8.len = 0x15f662;
      uv_pipe_connect(&ctx.connect_req,&ctx.channel,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_0015f68a;
    }
LAB_0015f6ce:
    puVar3 = loop;
    uStack_a8.len = 0x15f6d3;
    run_test_cold_2();
  }
  uStack_a8.len = (size_t)connect_cb;
  run_test_cold_5();
  if (puVar3 == (uv_loop_t *)&ctx.connect_req) {
    if (iVar2 != 0) goto LAB_0015f7a8;
    uStack_a8 = uv_buf_init(".",1);
    iVar1 = uv_write2(&ctx.write_req,(uv_stream_t *)&ctx,&uStack_a8,1,&ctx.send.stream,
                      (uv_write_cb)0x0);
    if (iVar1 != 0) goto LAB_0015f7ad;
    uStack_a8 = uv_buf_init(".",1);
    iVar1 = uv_write2(&ctx.write_req2,(uv_stream_t *)&ctx,&uStack_a8,1,&ctx.send2.stream,
                      (uv_write_cb)0x0);
    if (iVar1 == 0) {
      iVar1 = uv_read_start((uv_stream_t *)&ctx,alloc_cb,recv_cb);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015f7b7;
    }
  }
  else {
    connect_cb_cold_1();
LAB_0015f7a8:
    connect_cb_cold_2();
LAB_0015f7ad:
    connect_cb_cold_3();
  }
  connect_cb_cold_4();
LAB_0015f7b7:
  connect_cb_cold_5();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 8;
  return 0x2ff734;
}

Assistant:

int run_test(const char* test,
             int benchmark_output,
             int test_count) {
  char errmsg[1024] = "";
  process_info_t processes[1024];
  process_info_t *main_proc;
  task_entry_t* task;
  int process_count;
  int result;
  int status;
  int i;

  status = 255;
  main_proc = NULL;
  process_count = 0;

#ifndef _WIN32
  /* Clean up stale socket from previous run. */
  remove(TEST_PIPENAME);
  remove(TEST_PIPENAME_2);
  remove(TEST_PIPENAME_3);
#endif

  /* If it's a helper the user asks for, start it directly. */
  for (task = TASKS; task->main; task++) {
    if (task->is_helper && strcmp(test, task->process_name) == 0) {
      return task->main();
    }
  }

  /* Start the helpers first. */
  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) != 0) {
      continue;
    }

    /* Skip the test itself. */
    if (!task->is_helper) {
      continue;
    }

    if (process_start(task->task_name,
                      task->process_name,
                      &processes[process_count],
                      1 /* is_helper */) == -1) {
      snprintf(errmsg,
               sizeof errmsg,
               "Process `%s` failed to start.",
               task->process_name);
      goto out;
    }

    process_count++;
  }

  /* Now start the test itself. */
  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) != 0) {
      continue;
    }

    if (task->is_helper) {
      continue;
    }

    if (process_start(task->task_name,
                      task->process_name,
                      &processes[process_count],
                      0 /* !is_helper */) == -1) {
      snprintf(errmsg,
               sizeof errmsg,
               "Process `%s` failed to start.",
               task->process_name);
      goto out;
    }

    main_proc = &processes[process_count];
    process_count++;
    break;
  }

  if (main_proc == NULL) {
    snprintf(errmsg,
             sizeof errmsg,
             "No test with that name: %s",
             test);
    goto out;
  }

  result = process_wait(main_proc, 1, task->timeout);
  if (result == -1) {
    FATAL("process_wait failed");
  } else if (result == -2) {
    /* Don't have to clean up the process, process_wait() has killed it. */
    snprintf(errmsg,
             sizeof errmsg,
             "timeout");
    goto out;
  }

  status = process_reap(main_proc);
  if (status != TEST_OK) {
    snprintf(errmsg,
             sizeof errmsg,
             "exit code %d",
             status);
    goto out;
  }

  if (benchmark_output) {
    /* Give the helpers time to clean up their act. */
    uv_sleep(1000);
  }

out:
  /* Reap running processes except the main process, it's already dead. */
  for (i = 0; i < process_count - 1; i++) {
    process_terminate(&processes[i]);
  }

  if (process_count > 0 &&
      process_wait(processes, process_count - 1, -1) < 0) {
    FATAL("process_wait failed");
  }

  log_tap_result(test_count, test, status, &processes[i]);

  /* Show error and output from processes if the test failed. */
  if ((status != TEST_OK && status != TEST_SKIP) || task->show_output) {
    if (strlen(errmsg) > 0)
      fprintf(stderr, "# %s\n", errmsg);
    fprintf(stderr, "# ");
    fflush(stderr);

    for (i = 0; i < process_count; i++) {
      switch (process_output_size(&processes[i])) {
       case -1:
        fprintf(stderr, "Output from process `%s`: (unavailable)\n",
                process_get_name(&processes[i]));
        fflush(stderr);
        break;

       case 0:
        fprintf(stderr, "Output from process `%s`: (no output)\n",
                process_get_name(&processes[i]));
        fflush(stderr);
        break;

       default:
        fprintf(stderr, "Output from process `%s`:\n", process_get_name(&processes[i]));
        fflush(stderr);
        process_copy_output(&processes[i], stderr);
        break;
      }
    }

  /* In benchmark mode show concise output from the main process. */
  } else if (benchmark_output) {
    switch (process_output_size(main_proc)) {
     case -1:
      fprintf(stderr, "%s: (unavailable)\n", test);
      fflush(stderr);
      break;

     case 0:
      fprintf(stderr, "%s: (no output)\n", test);
      fflush(stderr);
      break;

     default:
      for (i = 0; i < process_count; i++) {
        process_copy_output(&processes[i], stderr);
      }
      break;
    }
  }

  /* Clean up all process handles. */
  for (i = 0; i < process_count; i++) {
    process_cleanup(&processes[i]);
  }

  return status;
}